

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void multi_sink_example(void)

{
  long lVar1;
  sinks_init_list sinks;
  allocator local_141;
  shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> file_sink;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> console_sink;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120 [2];
  __shared_ptr<spdlog::sinks::sink,(__gnu_cxx::_Lock_policy)2> local_110 [16];
  string local_100;
  logger logger;
  
  std::make_shared<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>();
  spdlog::sinks::sink::set_level
            ((sink *)console_sink.
                     super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,warn);
  std::__cxx11::string::string
            ((string *)&logger,"[multi_sink_example] [%^%l%$] %v",(allocator *)local_120);
  spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_pattern
            (&(console_sink.
               super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_ansicolor_sink<spdlog::details::console_mutex>,(string *)&logger);
  std::__cxx11::string::~string((string *)&logger);
  logger._vptr_logger._0_1_ = 1;
  std::make_shared<spdlog::sinks::basic_file_sink<std::mutex>,char_const(&)[19],bool>
            ((char (*) [19])&file_sink,(bool *)"logs/multisink.txt");
  spdlog::sinks::sink::set_level
            ((sink *)file_sink.
                     super___shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,trace);
  std::__cxx11::string::string((string *)&local_100,"multi_sink",&local_141);
  std::__shared_ptr<spdlog::sinks::sink,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,void>
            ((__shared_ptr<spdlog::sinks::sink,(__gnu_cxx::_Lock_policy)2> *)local_120,
             &console_sink.
              super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<spdlog::sinks::sink,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>,void>
            (local_110,
             &file_sink.
              super___shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2>
            );
  sinks._M_len = 2;
  sinks._M_array = (iterator)local_120;
  spdlog::logger::logger(&logger,&local_100,sinks);
  lVar1 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_120[0]._M_pi + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  std::__cxx11::string::~string((string *)&local_100);
  spdlog::logger::set_level(&logger,debug);
  spdlog::logger::warn<char[44]>
            (&logger,(char (*) [44])"this should appear in both console and file");
  spdlog::logger::info<char[64]>
            (&logger,(char (*) [64])
                     "this message should not appear in the console, only in the file");
  spdlog::logger::~logger(&logger);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&file_sink.
              super___shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&console_sink.
              super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void multi_sink_example() {
    auto console_sink = std::make_shared<spdlog::sinks::stdout_color_sink_mt>();
    console_sink->set_level(spdlog::level::warn);
    console_sink->set_pattern("[multi_sink_example] [%^%l%$] %v");

    auto file_sink =
        std::make_shared<spdlog::sinks::basic_file_sink_mt>("logs/multisink.txt", true);
    file_sink->set_level(spdlog::level::trace);

    spdlog::logger logger("multi_sink", {console_sink, file_sink});
    logger.set_level(spdlog::level::debug);
    logger.warn("this should appear in both console and file");
    logger.info("this message should not appear in the console, only in the file");
}